

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cpp
# Opt level: O0

bool fs_is_prefix(string_view prefix,string_view path)

{
  string_view in;
  string_view in_00;
  bool bVar1;
  __type _Var2;
  size_type sVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined4 local_a8;
  undefined8 local_98;
  size_t sStack_90;
  undefined1 local_88 [8];
  string p;
  undefined1 local_50 [8];
  string pr;
  string_view path_local;
  string_view prefix_local;
  
  path_local._M_len = (size_t)path._M_str;
  pr.field_2._8_8_ = path._M_len;
  path_local._M_str = (char *)prefix._M_len;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&path_local._M_str);
  if ((!bVar1) &&
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)((long)&pr.field_2 + 8)
                        ), !bVar1)) {
    p.field_2._8_8_ = path_local._M_str;
    in_00._M_str = prefix._M_str;
    in_00._M_len = (size_t)path_local._M_str;
    fs_drop_slash_abi_cxx11_((string *)local_50,in_00);
    local_98 = pr.field_2._8_8_;
    sStack_90 = path_local._M_len;
    in._M_str = (char *)path_local._M_len;
    in._M_len = pr.field_2._8_8_;
    fs_drop_slash_abi_cxx11_((string *)local_88,in);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_88);
    if (_Var2) {
      prefix_local._M_str._7_1_ = true;
    }
    else {
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50);
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88);
      if (sVar4 < sVar3) {
        prefix_local._M_str._7_1_ = false;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
        std::__cxx11::string::substr((ulong)&local_c8,(ulong)local_88);
        prefix_local._M_str._7_1_ =
             std::operator==(&local_c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_50);
        std::__cxx11::string::~string((string *)&local_c8);
      }
    }
    local_a8 = 1;
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)local_50);
    return prefix_local._M_str._7_1_;
  }
  return false;
}

Assistant:

bool
fs_is_prefix(std::string_view prefix, std::string_view path)
{
  // is prefix a prefix of path. Does not normalize, canonicalize, or walk up the directory tree.
  // ".." is ambiguous and should be avoided in input

  if(prefix.empty() || path.empty())
    return false;

  std::string const pr = fs_drop_slash(prefix);
  std::string const p = fs_drop_slash(path);

  if (pr == p)
    return true;

  if (pr.size() > p.size())
    return false;

#ifdef __cpp_lib_starts_ends_with  // C++20
  return p.starts_with(pr);
#else
  return p.substr(0, pr.size()) == pr;
#endif

}